

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPEG2_Parser.cpp
# Opt level: O0

h__ParserState * __thiscall ASDCP::MPEG2::h__ParserState::Goto_GOP(h__ParserState *this)

{
  ILogSink *this_00;
  char *pcVar1;
  ParserState_t *in_RSI;
  h__ParserState *this_local;
  
  if ((*in_RSI == ST_SEQ) || (*in_RSI == ST_EXT)) {
    *in_RSI = ST_GOP;
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    pcVar1 = StringParserState(*in_RSI);
    Kumu::ILogSink::Error(this_00,"GOP follows %s\n",pcVar1);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

inline Result_t Goto_GOP()
  {
    switch ( m_State )
      {
      case ST_EXT:
      case ST_SEQ:
	m_State = ST_GOP;
	return RESULT_OK;
      default:
	break;
      }
    
    DefaultLogSink().Error("GOP follows %s\n", StringParserState(m_State));
    return RESULT_STATE;
  }